

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNFill.cpp
# Opt level: O3

int __thiscall
NaPNFill::verify(NaPNFill *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  NaPetriCnInput *this_00;
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  NaVector *pNVar5;
  NaVector *pNVar6;
  
  pNVar6 = &this->vFill;
  uVar1 = NaVector::dim(pNVar6);
  this_00 = &this->in;
  pNVar5 = NaPetriCnInput::data(this_00);
  uVar2 = (*pNVar5->_vptr_NaVector[6])(pNVar5);
  if (uVar1 != uVar2) {
    uVar1 = NaVector::dim(pNVar6);
    pNVar5 = NaPetriCnInput::data(this_00);
    uVar2 = (*pNVar5->_vptr_NaVector[6])(pNVar5);
    NaPrintLog("%s.%s: fill vector has mismatched dimension: %u!=%u\n",(ulong)uVar1,(ulong)uVar2);
  }
  pNVar5 = NaPetriCnOutput::data(&this->out);
  iVar3 = (*pNVar5->_vptr_NaVector[6])(pNVar5);
  pNVar5 = NaPetriCnInput::data(this_00);
  iVar4 = (*pNVar5->_vptr_NaVector[6])(pNVar5);
  if (iVar3 == iVar4) {
    uVar1 = NaVector::dim(pNVar6);
    pNVar6 = NaPetriCnInput::data(this_00);
    uVar2 = (*pNVar6->_vptr_NaVector[6])(pNVar6);
    if (uVar1 == uVar2) {
      pNVar6 = NaPetriCnOutput::data(&this->sync);
      iVar3 = (*pNVar6->_vptr_NaVector[6])(pNVar6);
      return CONCAT31((int3)((uint)iVar3 >> 8),iVar3 == 1);
    }
  }
  return 0;
}

Assistant:

bool
NaPNFill::verify ()
{
  if(vFill.dim() != in.data().dim()){
    NaPrintLog("%s.%s: fill vector has mismatched dimension: %u!=%u\n",
	       vFill.dim(), in.data().dim());
  }

  return out.data().dim() == in.data().dim()
    && vFill.dim() == in.data().dim()
    && 1 == sync.data().dim();
}